

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::TablePrinter::close(TablePrinter *this,int __fd)

{
  char cVar1;
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  if (this->m_isOpen == true) {
    uStack_18 = in_RAX;
    if (0 < this->m_currentColumn) {
      uStack_18 = CONCAT17(10,(int7)in_RAX);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this->m_os,(char *)((long)&uStack_18 + 7),1);
      this->m_currentColumn = -1;
    }
    cVar1 = (char)this->m_os;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->m_os + -0x18) + cVar1);
    std::ostream::put(cVar1);
    in_RAX = std::ostream::flush();
    this->m_isOpen = false;
  }
  return (int)in_RAX;
}

Assistant:

void close() {
        if (m_isOpen) {
            *this << RowBreak();
            m_os << std::endl;
            m_isOpen = false;
        }
    }